

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactoredDecPOMDPDiscrete.h
# Opt level: O1

Scope * __thiscall
FactoredDecPOMDPDiscrete::GetStateFactorScopeForLRF(FactoredDecPOMDPDiscrete *this,Index LRF)

{
  pointer pSVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = (ulong)LRF;
  pSVar1 = (this->_m_sfScopes).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = ((long)(this->_m_sfScopes).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pSVar1 >> 3) * -0x5555555555555555;
  if (uVar3 <= uVar2 && uVar2 - uVar3 != 0) {
    return pSVar1 + uVar3;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

const Scope& GetStateFactorScopeForLRF(Index LRF) const
    {return _m_sfScopes.at(LRF); }